

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t array_container_number_of_runs(array_container_t *ac)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  if ((long)ac->cardinality != 0) {
    lVar2 = 0;
    uVar4 = 0xfffffffe;
    iVar1 = 0;
    do {
      uVar3 = uVar4 + 1;
      uVar4 = (uint)*(ushort *)((long)ac->array + lVar2);
      iVar1 = iVar1 + (uint)(uVar3 != uVar4);
      lVar2 = lVar2 + 2;
    } while ((long)ac->cardinality * 2 != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int32_t array_container_number_of_runs(const array_container_t *ac) {
    // Can SIMD work here?
    int32_t nr_runs = 0;
    int32_t prev = -2;
    for (const uint16_t *p = ac->array; p != ac->array + ac->cardinality; ++p) {
        if (*p != prev + 1) nr_runs++;
        prev = *p;
    }
    return nr_runs;
}